

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintInt64
          (FastFieldValuePrinter *this,int64_t val,BaseTextGenerator *generator)

{
  AlphaNum *a;
  string local_68;
  AlphaNum local_48;
  
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,val);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)&local_48,a);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintInt64(
    int64_t val, BaseTextGenerator* generator) const {
  generator->PrintString(absl::StrCat(val));
}